

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixtls.cpp
# Opt level: O3

TheCustomHeapType * initializeCustomHeap(void)

{
  HoardHeapType *pHVar1;
  TheCustomHeapType *pTVar2;
  long *in_FS_OFFSET;
  
  pTVar2 = (TheCustomHeapType *)*in_FS_OFFSET;
  if (pTVar2 == (TheCustomHeapType *)0x0) {
    pTVar2 = (TheCustomHeapType *)*in_FS_OFFSET;
    pHVar1 = getMainHoardHeap();
    in_FS_OFFSET[0x10] = (long)pHVar1;
    in_FS_OFFSET[0x11] = 0;
    in_FS_OFFSET[0x12] = 0;
    in_FS_OFFSET[0x13] = 0;
    in_FS_OFFSET[0x14] = 0;
    in_FS_OFFSET[0x15] = 0;
    in_FS_OFFSET[0x16] = 0;
    in_FS_OFFSET[0x17] = 0;
    in_FS_OFFSET[0x18] = 0;
    in_FS_OFFSET[0x19] = 0;
    in_FS_OFFSET[0x1a] = 0;
    in_FS_OFFSET[0x1b] = 0;
    in_FS_OFFSET[0x1c] = 0;
    in_FS_OFFSET[0x1d] = 0;
    in_FS_OFFSET[0x1e] = 0;
    in_FS_OFFSET[0x1f] = 0;
    in_FS_OFFSET[0x20] = 0;
    *in_FS_OFFSET = (long)pTVar2;
  }
  return pTVar2;
}

Assistant:

static TheCustomHeapType * initializeCustomHeap() {
  auto tlab = theTLAB;
  if (tlab == nullptr) {
    new (reinterpret_cast<char *>(&tlabBuffer)) TheCustomHeapType(getMainHoardHeap());
    tlab = reinterpret_cast<TheCustomHeapType *>(&tlabBuffer);
    theTLAB = tlab;
  }
  return tlab;
}